

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChNodeFEAcurv.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChNodeFEAcurv::ChNodeFEAcurv
          (ChNodeFEAcurv *this,void **vtt,ChVector<double> *rxx,ChVector<double> *ryy,
          ChVector<double> *rzz)

{
  _func_int **pp_Var1;
  long lVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  ChVariablesGenericDiagonalMass *this_00;
  
  pp_Var1 = (_func_int **)vtt[1];
  (this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase = pp_Var1;
  *(void **)((long)(this->m_ryy).m_data + (long)(pp_Var1[-3] + -0x38)) = vtt[2];
  pp_Var1 = (_func_int **)*vtt;
  (this->super_ChNodeFEAbase)._vptr_ChNodeFEAbase = pp_Var1;
  *(void **)((long)(this->m_ryy).m_data + (long)(pp_Var1[-3] + -0x38)) = vtt[3];
  *(double *)&(this->super_ChNodeFEAbase).field_0x20 = rxx->m_data[0];
  *(double *)&this->field_0x28 = rxx->m_data[1];
  *(double *)&this->field_0x30 = rxx->m_data[2];
  (this->m_ryy).m_data[0] = ryy->m_data[0];
  (this->m_ryy).m_data[1] = ryy->m_data[1];
  (this->m_ryy).m_data[2] = ryy->m_data[2];
  (this->m_rzz).m_data[0] = rzz->m_data[0];
  (this->m_rzz).m_data[1] = rzz->m_data[1];
  (this->m_rzz).m_data[2] = rzz->m_data[2];
  dVar3 = VNULL;
  (this->m_rxx_dt).m_data[0] = VNULL;
  dVar4 = DAT_00b90ac0;
  (this->m_rxx_dt).m_data[1] = DAT_00b90ac0;
  dVar5 = DAT_00b90ac8;
  (this->m_rxx_dt).m_data[2] = DAT_00b90ac8;
  (this->m_ryy_dt).m_data[0] = dVar3;
  (this->m_ryy_dt).m_data[1] = dVar4;
  (this->m_ryy_dt).m_data[2] = dVar5;
  (this->m_rzz_dt).m_data[0] = dVar3;
  (this->m_rzz_dt).m_data[1] = dVar4;
  (this->m_rzz_dt).m_data[2] = dVar5;
  (this->m_rxx_dtdt).m_data[0] = dVar3;
  (this->m_rxx_dtdt).m_data[1] = dVar4;
  (this->m_rxx_dtdt).m_data[2] = dVar5;
  (this->m_ryy_dtdt).m_data[0] = dVar3;
  (this->m_ryy_dtdt).m_data[1] = dVar4;
  (this->m_ryy_dtdt).m_data[2] = dVar5;
  (this->m_rzz_dtdt).m_data[0] = dVar3;
  (this->m_rzz_dtdt).m_data[1] = dVar4;
  (this->m_rzz_dtdt).m_data[2] = dVar5;
  this_00 = (ChVariablesGenericDiagonalMass *)::operator_new(0x50);
  ChVariablesGenericDiagonalMass::ChVariablesGenericDiagonalMass(this_00,9);
  *(ChVariablesGenericDiagonalMass **)&(this->super_ChNodeFEAbase).field_0x18 = this_00;
  lVar2 = (this_00->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
          m_storage.m_rows;
  if (lVar2 < 0) {
    __assert_fail("rows >= 0 && (RowsAtCompileTime == Dynamic || RowsAtCompileTime == rows) && cols >= 0 && (ColsAtCompileTime == Dynamic || ColsAtCompileTime == cols)"
                  ,"/usr/include/eigen3/Eigen/src/Core/CwiseNullaryOp.h",0x4a,
                  "Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>, Eigen::Matrix<double, -1, 1>>::CwiseNullaryOp(Index, Index, const NullaryOp &) [NullaryOp = Eigen::internal::scalar_constant_op<double>, MatrixType = Eigen::Matrix<double, -1, 1>]"
                 );
  }
  if (lVar2 != 0) {
    memset((this_00->MmassDiag).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
           m_storage.m_data,0,lVar2 << 3);
    return;
  }
  return;
}

Assistant:

ChNodeFEAcurv::ChNodeFEAcurv(const ChVector<>& rxx, const ChVector<>& ryy, const ChVector<>& rzz)
    : m_rxx(rxx),
      m_ryy(ryy),
      m_rzz(rzz),
      m_rxx_dt(VNULL),
      m_ryy_dt(VNULL),
      m_rzz_dt(VNULL),
      m_rxx_dtdt(VNULL),
      m_ryy_dtdt(VNULL),
      m_rzz_dtdt(VNULL) {
    m_variables = new ChVariablesGenericDiagonalMass(9);
    m_variables->GetMassDiagonal().setZero();
}